

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
llvm::SmallVectorImpl<llvm::DWARFDebugMacro::Entry>::emplace_back<>
          (SmallVectorImpl<llvm::DWARFDebugMacro::Entry> *this)

{
  undefined8 *puVar1;
  void *pvVar2;
  uint uVar3;
  reference pEVar4;
  
  uVar3 = (this->super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>).
          super_SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>.super_SmallVectorBase.
          Size;
  if ((this->super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>).
      super_SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>.super_SmallVectorBase.
      Capacity <= uVar3) {
    SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>::grow
              (&this->super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>,0);
    uVar3 = (this->super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>).
            super_SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>.
            super_SmallVectorBase.Size;
  }
  pvVar2 = (this->super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>).
           super_SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>.super_SmallVectorBase
           .BeginX;
  *(undefined8 *)((long)pvVar2 + (ulong)uVar3 * 0x18 + 0x10) = 0;
  puVar1 = (undefined8 *)((long)pvVar2 + (ulong)uVar3 * 0x18);
  *puVar1 = 0;
  puVar1[1] = 0;
  SmallVectorBase::set_size
            ((SmallVectorBase *)this,
             (ulong)(this->super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>).
                    super_SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>.
                    super_SmallVectorBase.Size + 1);
  pEVar4 = SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>::back
                     ((SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void> *)this);
  return pEVar4;
}

Assistant:

reference emplace_back(ArgTypes &&... Args) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    ::new ((void *)this->end()) T(std::forward<ArgTypes>(Args)...);
    this->set_size(this->size() + 1);
    return this->back();
  }